

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O0

int ZIP_seek(PHYSFS_Io *_io,PHYSFS_uint64 offset)

{
  undefined8 *puVar1;
  ZIPentry *entry_00;
  long lVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint local_2bc;
  undefined1 local_2b8 [4];
  PHYSFS_uint32 maxread;
  PHYSFS_uint8 buf [512];
  mz_stream str;
  PHYSFS_sint64 newpos;
  int encrypted;
  PHYSFS_Io *io;
  ZIPentry *entry;
  ZIPfileinfo *finfo;
  PHYSFS_uint64 offset_local;
  PHYSFS_Io *_io_local;
  
  puVar1 = (undefined8 *)_io->opaque;
  entry_00 = (ZIPentry *)*puVar1;
  lVar2 = puVar1[1];
  iVar3 = zip_entry_is_tradional_crypto(entry_00);
  if (entry_00->uncompressed_size < offset) {
    PHYSFS_setErrorCode(PHYSFS_ERR_PAST_EOF);
    _io_local._4_4_ = 0;
  }
  else if ((iVar3 == 0) && (entry_00->compression_method == 0)) {
    iVar3 = (**(code **)(lVar2 + 0x20))(lVar2,offset + entry_00->offset);
    if (iVar3 == 0) {
      _io_local._4_4_ = 0;
    }
    else {
      *(int *)((long)puVar1 + 0x14) = (int)offset;
LAB_001274ff:
      _io_local._4_4_ = 1;
    }
  }
  else {
    if (offset < *(uint *)((long)puVar1 + 0x14)) {
      initializeZStream((mz_stream *)(buf + 0x1f8));
      iVar4 = mz_inflateInit2((mz_streamp)(buf + 0x1f8),-0xf);
      iVar4 = zlib_err(iVar4);
      if (iVar4 != 0) {
        return 0;
      }
      iVar4 = 0;
      if (iVar3 != 0) {
        iVar4 = 0xc;
      }
      iVar4 = (**(code **)(lVar2 + 0x20))(lVar2,entry_00->offset + (long)iVar4);
      if (iVar4 == 0) {
        return 0;
      }
      mz_inflateEnd((mz_streamp)(puVar1 + 7));
      memcpy(puVar1 + 7,buf + 0x1f8,0x70);
      *(undefined4 *)(puVar1 + 2) = 0;
      *(undefined4 *)((long)puVar1 + 0x14) = 0;
      if (iVar3 != 0) {
        puVar1[4] = *(undefined8 *)((long)puVar1 + 0x2c);
        *(undefined4 *)(puVar1 + 5) = *(undefined4 *)((long)puVar1 + 0x34);
      }
    }
    do {
      if (*(uint *)((long)puVar1 + 0x14) == offset) goto LAB_001274ff;
      local_2bc = (int)offset - *(int *)((long)puVar1 + 0x14);
      if (0x200 < local_2bc) {
        local_2bc = 0x200;
      }
      uVar5 = ZIP_read(_io,local_2b8,(ulong)local_2bc);
    } while (uVar5 == local_2bc);
    _io_local._4_4_ = 0;
  }
  return _io_local._4_4_;
}

Assistant:

static int ZIP_seek(PHYSFS_Io *_io, PHYSFS_uint64 offset)
{
    ZIPfileinfo *finfo = (ZIPfileinfo *) _io->opaque;
    ZIPentry *entry = finfo->entry;
    PHYSFS_Io *io = finfo->io;
    const int encrypted = zip_entry_is_tradional_crypto(entry);

    BAIL_IF(offset > entry->uncompressed_size, PHYSFS_ERR_PAST_EOF, 0);

    if (!encrypted && (entry->compression_method == COMPMETH_NONE))
    {
        PHYSFS_sint64 newpos = offset + entry->offset;
        BAIL_IF_ERRPASS(!io->seek(io, newpos), 0);
        finfo->uncompressed_position = (PHYSFS_uint32) offset;
    } /* if */

    else
    {
        /*
         * If seeking backwards, we need to redecode the file
         *  from the start and throw away the compressed bits until we hit
         *  the offset we need. If seeking forward, we still need to
         *  decode, but we don't rewind first.
         */
        if (offset < finfo->uncompressed_position)
        {
            /* we do a copy so state is sane if inflateInit2() fails. */
            z_stream str;
            initializeZStream(&str);
            if (zlib_err(inflateInit2(&str, -MAX_WBITS)) != Z_OK)
                return 0;

            if (!io->seek(io, entry->offset + (encrypted ? 12 : 0)))
                return 0;

            inflateEnd(&finfo->stream);
            memcpy(&finfo->stream, &str, sizeof (z_stream));
            finfo->uncompressed_position = finfo->compressed_position = 0;

            if (encrypted)
                memcpy(finfo->crypto_keys, finfo->initial_crypto_keys, 12);
        } /* if */

        while (finfo->uncompressed_position != offset)
        {
            PHYSFS_uint8 buf[512];
            PHYSFS_uint32 maxread;

            maxread = (PHYSFS_uint32) (offset - finfo->uncompressed_position);
            if (maxread > sizeof (buf))
                maxread = sizeof (buf);

            if (ZIP_read(_io, buf, maxread) != maxread)
                return 0;
        } /* while */
    } /* else */

    return 1;
}